

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingBaseCase::buildLayout
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *binding)

{
  ostream *poVar1;
  ostringstream s;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  if (binding->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"layout(binding=",0xf)
    ;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)auStack_188,(binding->_M_dataplus)._M_p,binding->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

virtual String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ") ";
		return s.str();
	}